

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

Vec_Wec_t * Sbd_ManWindowRoots(Gia_Man_t *p,int nTfoLevels,int nTfoFanMax)

{
  uint *puVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  uint *__ptr;
  void *pvVar8;
  int *__ptr_00;
  void *__s;
  long lVar9;
  int *piVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  int *piVar13;
  ulong uVar14;
  int Fill;
  int *piVar15;
  ulong uVar16;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  long lVar17;
  int iVar18;
  uint uVar19;
  size_t __size;
  int *piVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  long lVar26;
  uint local_7c;
  
  uVar12 = p->nObjs;
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  uVar23 = 8;
  if (6 < uVar12 - 1) {
    uVar23 = uVar12;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar23;
  if (uVar23 == 0) {
    pVVar7 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar7 = (Vec_Int_t *)calloc((long)(int)uVar23,0x10);
  }
  pVVar6->pArray = pVVar7;
  pVVar6->nSize = uVar12;
  __ptr = (uint *)malloc(0x10);
  __ptr[1] = 0;
  *__ptr = uVar23;
  if (uVar23 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = calloc((long)(int)uVar23,0x10);
  }
  *(void **)(__ptr + 2) = pvVar8;
  __ptr[1] = uVar12;
  iVar18 = (((int)uVar12 >> 5) + 1) - (uint)((uVar12 & 0x1f) == 0);
  __ptr_00 = (int *)malloc(0x10);
  __ptr_00[1] = 0;
  *__ptr_00 = iVar18 * 0x20;
  if (iVar18 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar18 * 4);
  }
  *(void **)(__ptr_00 + 2) = __s;
  __ptr_00[1] = iVar18 * 0x20;
  memset(__s,0,(long)iVar18 << 2);
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  Gia_ManCleanMark0(p);
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar17 = 0;
    do {
      iVar18 = pVVar7->pArray[lVar17];
      if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) goto LAB_00535f18;
      if (iVar18 == 0) break;
      if ((int)uVar12 <= iVar18) goto LAB_00535ebb;
      lVar9 = (long)iVar18 * 0x10;
      pVVar7 = (Vec_Int_t *)((long)pvVar8 + lVar9);
      if (*(int *)((long)pvVar8 + lVar9) < 1) {
        if (pVVar7->pArray == (int *)0x0) {
          piVar10 = (int *)malloc(4);
        }
        else {
          piVar10 = (int *)realloc(pVVar7->pArray,4);
        }
        pVVar7->pArray = piVar10;
        if (piVar10 == (int *)0x0) goto LAB_00535ff1;
        pVVar7->nCap = 1;
      }
      Vec_IntPush(pVVar7,iVar18);
      lVar17 = lVar17 + 1;
      pVVar7 = p->vCis;
    } while (lVar17 < pVVar7->nSize);
  }
  pVVar7 = p->vCos;
  if (0 < pVVar7->nSize) {
    piVar10 = pVVar7->pArray;
    lVar17 = 0;
    do {
      iVar18 = piVar10[lVar17];
      if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) {
LAB_00535f18:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar12 = iVar18 - (*(uint *)(p->pObjs + iVar18) & 0x1fffffff);
      if (((int)uVar12 < 0) || (__ptr_00[1] <= (int)uVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      puVar1 = (uint *)(*(long *)(__ptr_00 + 2) + (ulong)(uVar12 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar12 & 0x1f);
      lVar17 = lVar17 + 1;
    } while (lVar17 < pVVar7->nSize);
  }
  if (0 < p->nObjs) {
    uVar25 = 0;
    do {
      uVar12 = (uint)*(undefined8 *)(p->pObjs + uVar25);
      if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
        if ((long)__ptr_00[1] <= (long)uVar25) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        uVar23 = (uint)uVar25;
        bVar5 = true;
        if ((*(uint *)(*(long *)(__ptr_00 + 2) + (uVar25 >> 5 & 0x7ffffff) * 4) >> (uVar23 & 0x1f) &
            1) == 0) {
          bVar5 = nTfoFanMax <= p->pRefs[uVar25];
        }
        uVar12 = uVar23 - (uVar12 & 0x1fffffff);
        if ((int)uVar12 < 0) {
LAB_00535ebb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        uVar22 = __ptr[1];
        if (((((int)uVar22 <= (int)uVar12) ||
             (uVar19 = uVar23 - ((uint)((ulong)*(undefined8 *)(p->pObjs + uVar25) >> 0x20) &
                                0x1fffffff), (int)uVar19 < 0)) || ((int)uVar22 <= (int)uVar19)) ||
           ((long)(int)uVar22 <= (long)uVar25)) goto LAB_00535ebb;
        lVar17 = *(long *)(__ptr + 2);
        lVar26 = (ulong)uVar12 * 0x10 + lVar17;
        lVar21 = (ulong)uVar19 * 0x10 + lVar17;
        pVVar7 = (Vec_Int_t *)(lVar17 + uVar25 * 0x10);
        lVar9 = (long)*(int *)(lVar21 + 4) + (long)*(int *)(lVar26 + 4);
        iVar18 = (int)lVar9;
        if (*(int *)(lVar17 + uVar25 * 0x10) < iVar18) {
          __size = lVar9 * 4;
          if (pVVar7->pArray == (int *)0x0) {
            piVar10 = (int *)malloc(__size);
          }
          else {
            piVar10 = (int *)realloc(pVVar7->pArray,__size);
          }
          pVVar7->pArray = piVar10;
          if (piVar10 == (int *)0x0) {
LAB_00535ff1:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar7->nCap = iVar18;
        }
        piVar4 = pVVar7->pArray;
        piVar20 = *(int **)(lVar26 + 8);
        piVar13 = *(int **)(lVar21 + 8);
        piVar10 = piVar20 + *(int *)(lVar26 + 4);
        piVar2 = piVar13 + *(int *)(lVar21 + 4);
        piVar15 = piVar4;
        if ((0 < (long)*(int *)(lVar26 + 4)) && (0 < *(int *)(lVar21 + 4))) {
          do {
            iVar18 = *piVar20;
            iVar24 = *piVar13;
            if (iVar18 == iVar24) {
              piVar20 = piVar20 + 1;
              *piVar15 = iVar18;
              piVar13 = piVar13 + 1;
            }
            else if (iVar18 < iVar24) {
              piVar20 = piVar20 + 1;
              *piVar15 = iVar18;
            }
            else {
              piVar13 = piVar13 + 1;
              *piVar15 = iVar24;
            }
            piVar15 = piVar15 + 1;
          } while ((piVar20 < piVar10) && (piVar13 < piVar2));
        }
        for (; piVar20 < piVar10; piVar20 = piVar20 + 1) {
          *piVar15 = *piVar20;
          piVar15 = piVar15 + 1;
        }
        for (; piVar13 < piVar2; piVar13 = piVar13 + 1) {
          *piVar15 = *piVar13;
          piVar15 = piVar15 + 1;
        }
        uVar16 = (ulong)((long)piVar15 - (long)piVar4) >> 2;
        iVar18 = (int)uVar16;
        pVVar7->nSize = iVar18;
        if (pVVar7->nCap < iVar18) {
          __assert_fail("vArr->nSize <= vArr->nCap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x740,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar18 < *(int *)(lVar26 + 4)) {
          __assert_fail("vArr->nSize >= vArr1->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x741,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        if (iVar18 < *(int *)(lVar21 + 4)) {
          __assert_fail("vArr->nSize >= vArr2->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x742,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
        }
        iVar18 = pVVar7->nSize;
        if (iVar18 < 1) {
          local_7c = 0;
        }
        else {
          lVar17 = 0;
          local_7c = 0;
          do {
            uVar12 = pVVar7->pArray[lVar17];
            if (bVar5) {
              if (pVVar6->nSize <= (int)uVar12) {
                iVar24 = uVar12 + 1;
                iVar18 = pVVar6->nSize * 2;
                if (iVar18 <= iVar24) {
                  iVar18 = iVar24;
                }
                iVar3 = pVVar6->nCap;
                if (iVar3 < iVar18) {
                  if (pVVar6->pArray == (Vec_Int_t *)0x0) {
                    pVVar11 = (Vec_Int_t *)malloc((long)iVar18 << 4);
                  }
                  else {
                    pVVar11 = (Vec_Int_t *)realloc(pVVar6->pArray,(long)iVar18 << 4);
                  }
                  pVVar6->pArray = pVVar11;
                  memset(pVVar11 + iVar3,0,(long)(iVar18 - iVar3) << 4);
                  pVVar6->nCap = iVar18;
                }
                pVVar6->nSize = iVar24;
              }
              if (((int)uVar12 < 0) || (pVVar6->nSize <= (int)uVar12)) goto LAB_00535ebb;
              Vec_IntPush(pVVar6->pArray + uVar12,uVar23 * 2 + 1);
              uVar16 = extraout_RDX;
            }
            else {
              pVVar11 = p->vLevels;
              Vec_IntFillExtra(pVVar11,uVar23 + 1,(int)uVar16);
              if ((long)pVVar11->nSize <= (long)uVar25) {
LAB_00535eda:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar18 = pVVar11->pArray[uVar25];
              pVVar11 = p->vLevels;
              uVar22 = uVar12 + 1;
              Vec_IntFillExtra(pVVar11,uVar22,Fill);
              if (((int)uVar12 < 0) || (pVVar11->nSize <= (int)uVar12)) goto LAB_00535eda;
              iVar18 = iVar18 - pVVar11->pArray[uVar12];
              if (pVVar6->nSize <= (int)uVar12) {
                uVar19 = pVVar6->nSize * 2;
                if ((int)uVar19 <= (int)uVar22) {
                  uVar19 = uVar22;
                }
                iVar24 = pVVar6->nCap;
                if (iVar24 < (int)uVar19) {
                  if (pVVar6->pArray == (Vec_Int_t *)0x0) {
                    pVVar11 = (Vec_Int_t *)malloc((ulong)uVar19 << 4);
                  }
                  else {
                    pVVar11 = (Vec_Int_t *)realloc(pVVar6->pArray,(ulong)uVar19 << 4);
                  }
                  pVVar6->pArray = pVVar11;
                  memset(pVVar11 + iVar24,0,(long)(int)(uVar19 - iVar24) << 4);
                  pVVar6->nCap = uVar19;
                }
                pVVar6->nSize = uVar22;
              }
              if (pVVar6->nSize <= (int)uVar12) goto LAB_00535ebb;
              Vec_IntPush(pVVar6->pArray + uVar12,(uint)(nTfoLevels <= iVar18) | uVar23 * 2);
              uVar16 = extraout_RDX_00;
              if (iVar18 < nTfoLevels) {
                if (((int)local_7c < 0) || (pVVar7->nSize <= (int)local_7c)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                }
                uVar14 = (ulong)local_7c;
                local_7c = local_7c + 1;
                uVar16 = (ulong)local_7c;
                pVVar7->pArray[uVar14] = uVar12;
              }
            }
            lVar17 = lVar17 + 1;
            iVar18 = pVVar7->nSize;
          } while (lVar17 < iVar18);
        }
        if (iVar18 < (int)local_7c) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        pVVar7->nSize = local_7c;
        if (!bVar5) {
          Vec_IntPush(pVVar7,uVar23);
        }
      }
      uVar25 = uVar25 + 1;
    } while ((long)uVar25 < (long)p->nObjs);
  }
  uVar12 = *__ptr;
  if (0 < (long)(int)uVar12) {
    lVar17 = *(long *)(__ptr + 2);
    lVar9 = 0;
    do {
      pvVar8 = *(void **)(lVar17 + 8 + lVar9);
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
        *(undefined8 *)(lVar17 + 8 + lVar9) = 0;
      }
      lVar9 = lVar9 + 0x10;
    } while ((long)(int)uVar12 * 0x10 != lVar9);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  __ptr[0] = 0;
  __ptr[1] = 0;
  free(__ptr);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  free(__ptr_00);
  return pVVar6;
}

Assistant:

Vec_Wec_t * Sbd_ManWindowRoots( Gia_Man_t * p, int nTfoLevels, int nTfoFanMax )
{
    Vec_Wec_t * vTfos = Vec_WecStart( Gia_ManObjNum(p) ); // TFO nodes with roots marked
    Vec_Wec_t * vTemp = Vec_WecStart( Gia_ManObjNum(p) ); // storage
    Vec_Int_t * vNodes, * vNodes0, * vNodes1;
    Vec_Bit_t * vPoDrivers = Vec_BitStart( Gia_ManObjNum(p) );
    int i, k, k2, Id, Fan;
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    Gia_ManCleanMark0( p );
    Gia_ManForEachCiId( p, Id, i )
    {
        vNodes = Vec_WecEntry( vTemp, Id );
        Vec_IntGrow( vNodes, 1 );
        Vec_IntPush( vNodes, Id );
    }
    Gia_ManForEachCoDriverId( p, Id, i )
        Vec_BitWriteEntry( vPoDrivers, Id, 1 );
    Gia_ManForEachAndId( p, Id )
    {
        int fAlwaysRoot = Vec_BitEntry(vPoDrivers, Id) || (Gia_ObjRefNumId(p, Id) >= nTfoFanMax);
        vNodes0 = Vec_WecEntry( vTemp, Gia_ObjFaninId0(Gia_ManObj(p, Id), Id) );
        vNodes1 = Vec_WecEntry( vTemp, Gia_ObjFaninId1(Gia_ManObj(p, Id), Id) );
        vNodes = Vec_WecEntry( vTemp, Id );
        Vec_IntTwoMerge2( vNodes0, vNodes1, vNodes );
        k2 = 0;
        Vec_IntForEachEntry( vNodes, Fan, k )
        {
            int fRoot = fAlwaysRoot || (Gia_ObjLevelId(p, Id) - Gia_ObjLevelId(p, Fan) >= nTfoLevels);
            Vec_WecPush( vTfos, Fan, Abc_Var2Lit(Id, fRoot) );
            if ( !fRoot ) Vec_IntWriteEntry( vNodes, k2++, Fan );
        }
        Vec_IntShrink( vNodes, k2 );
        if ( !fAlwaysRoot )
            Vec_IntPush( vNodes, Id );
    }
    Vec_WecFree( vTemp );
    Vec_BitFree( vPoDrivers );

    // print the results
    if ( 0 )
    Vec_WecForEachLevel( vTfos, vNodes, i )
    {
        if ( !Gia_ObjIsAnd(Gia_ManObj(p, i)) )
            continue;
        printf( "Node %3d : ", i );
        Vec_IntForEachEntry( vNodes, Fan, k )
            printf( "%d%s ", Abc_Lit2Var(Fan), Abc_LitIsCompl(Fan)? "*":"" );
        printf( "\n" );
    }

    return vTfos;
}